

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void analyzeOneTable(Parse *pParse,Table *pTab,Index *pOnlyIdx,int iStatCur,int iMem,int iTab)

{
  uint uVar1;
  sqlite3 *db;
  Vdbe *p;
  Parse *pPVar2;
  int *piVar3;
  Op *pOVar4;
  bool bVar5;
  int iVar6;
  int p2;
  int p1;
  int iVar7;
  uint uVar8;
  uint p2_00;
  int iVar9;
  Vdbe *p_00;
  KeyInfo *zP4;
  void *p_01;
  CollSeq *zP4_00;
  int p2_01;
  int p2_02;
  int p3;
  int p1_00;
  Schema **ppSVar10;
  int iDb;
  ulong uVar11;
  Index *pIdx;
  uint uVar12;
  char *pcVar13;
  ulong uVar14;
  
  db = pParse->db;
  p1_00 = iMem + 7;
  iVar6 = pParse->nMem;
  if (pParse->nMem <= p1_00) {
    iVar6 = p1_00;
  }
  pParse->nMem = iVar6;
  p_00 = sqlite3GetVdbe(pParse);
  if ((pTab != (Table *)0x0 && p_00 != (Vdbe *)0x0) && (pTab->tnum != 0)) {
    pcVar13 = pTab->zName;
    iVar6 = sqlite3_strnicmp(pcVar13,"sqlite_",7);
    if (iVar6 != 0) {
      if (pTab->pSchema == (Schema *)0x0) {
        uVar11 = 0xfff0bdc0;
      }
      else {
        uVar12 = db->nDb;
        if ((int)uVar12 < 1) {
          uVar11 = 0;
        }
        else {
          ppSVar10 = &db->aDb->pSchema;
          uVar11 = 0;
          do {
            if (*ppSVar10 == pTab->pSchema) goto LAB_00170121;
            uVar11 = uVar11 + 1;
            ppSVar10 = ppSVar10 + 4;
          } while (uVar12 != uVar11);
          uVar11 = (ulong)uVar12;
        }
      }
LAB_00170121:
      iDb = (int)uVar11;
      iVar6 = sqlite3AuthCheck(pParse,0x1c,pcVar13,(char *)0x0,db->aDb[iDb].zName);
      if (iVar6 == 0) {
        p2_01 = iMem + 3;
        p2_02 = iMem + 4;
        p3 = iMem + 6;
        sqlite3TableLock(pParse,iDb,pTab->tnum,'\0',pTab->zName);
        iVar6 = iTab + 2;
        if (iTab + 2 < pParse->nTab) {
          iVar6 = pParse->nTab;
        }
        pParse->nTab = iVar6;
        sqlite3OpenTable(pParse,iTab,iDb,pTab,0x36);
        pcVar13 = pTab->zName;
        iVar6 = sqlite3VdbeAddOp3(p_00,0x61,0,p2_02,0);
        sqlite3VdbeChangeP4(p_00,iVar6,pcVar13,0);
        pIdx = pTab->pIndex;
        if (pIdx == (Index *)0x0) {
          bVar5 = true;
        }
        else {
          iVar6 = iMem + 1;
          p2 = iMem + 2;
          p1 = iTab + 1;
          bVar5 = true;
          do {
            if (pOnlyIdx == (Index *)0x0 || pIdx == pOnlyIdx) {
              if (pIdx->pPartIdxWhere == (Expr *)0x0) {
                bVar5 = false;
              }
              if (((pTab->tabFlags & 0x20) == 0) || ((pIdx->field_0x5b & 3) != 2)) {
                uVar8 = (uint)pIdx->nColumn;
                pcVar13 = pIdx->zName;
                uVar12 = uVar8;
                if ((pIdx->field_0x5b & 8) != 0) {
                  uVar12 = (uint)pIdx->nKeyCol;
                }
              }
              else {
                uVar8 = (uint)pIdx->nKeyCol;
                pcVar13 = pTab->zName;
                uVar12 = uVar8;
              }
              iVar7 = sqlite3VdbeAddOp3(p_00,0x61,0,iMem + 5,0);
              sqlite3VdbeChangeP4(p_00,iVar7,pcVar13,0);
              iVar7 = p1_00 + uVar12 + -1;
              if (iVar7 < pParse->nMem) {
                iVar7 = pParse->nMem;
              }
              pParse->nMem = iVar7;
              sqlite3VdbeAddOp3(p_00,0x36,p1,pIdx->tnum,iDb);
              p = pParse->pVdbe;
              zP4 = sqlite3KeyInfoOfIndex(pParse,pIdx);
              sqlite3VdbeChangeP4(p,-1,(char *)zP4,-6);
              sqlite3VdbeAddOp3(p_00,0x19,uVar8,p2,0);
              sqlite3VdbeAddOp3(p_00,0x19,(uint)pIdx->nKeyCol,p2_01,0);
              sqlite3VdbeAddOp3(p_00,1,0,p2,iVar6);
              sqlite3VdbeChangeP4(p_00,-1,(char *)&statInitFuncdef,-5);
              if (p_00->aOp != (Op *)0x0) {
                p_00->aOp[(long)p_00->nOp + -1].p5 = '\x02';
              }
              uVar8 = sqlite3VdbeAddOp3(p_00,0x6c,p1,0,0);
              sqlite3VdbeAddOp3(p_00,0x19,0,p2,0);
              iVar7 = p_00->nOp;
              if (1 < uVar12) {
                uVar12 = uVar12 - 1;
                p2_00 = sqlite3VdbeMakeLabel(p_00);
                p_01 = sqlite3DbMallocRaw(db,(ulong)uVar12 << 2);
                if (p_01 != (void *)0x0) {
                  sqlite3VdbeAddOp3(p_00,0x10,0,0,0);
                  iVar7 = p_00->nOp;
                  if (((uVar12 == 1) && (pIdx->nKeyCol == 1)) && (pIdx->onError != '\0')) {
                    sqlite3VdbeAddOp3(p_00,0x4d,p1_00,p2_00,0);
                  }
                  uVar11 = 1;
                  if (1 < (int)uVar12) {
                    uVar11 = (ulong)uVar12;
                  }
                  uVar14 = 0;
                  do {
                    zP4_00 = sqlite3LocateCollSeq(pParse,pIdx->azColl[uVar14]);
                    iVar9 = (int)uVar14;
                    sqlite3VdbeAddOp3(p_00,0x19,iVar9,p2,0);
                    sqlite3VdbeAddOp3(p_00,0x2f,p1,iVar9,p2_01);
                    iVar9 = sqlite3VdbeAddOp3(p_00,0x4e,p2_01,0,p1_00 + iVar9);
                    sqlite3VdbeChangeP4(p_00,iVar9,(char *)zP4_00,-4);
                    *(int *)((long)p_01 + uVar14 * 4) = iVar9;
                    if (p_00->aOp != (Op *)0x0) {
                      p_00->aOp[(long)p_00->nOp + -1].p5 = 0x80;
                    }
                    uVar14 = uVar14 + 1;
                  } while (uVar11 != uVar14);
                  sqlite3VdbeAddOp3(p_00,0x19,uVar12,p2,0);
                  sqlite3VdbeAddOp3(p_00,0x10,0,p2_00,0);
                  uVar12 = p_00->nOp;
                  if (iVar7 - 1U < uVar12) {
                    p_00->aOp[iVar7 - 1U].p2 = uVar12;
                  }
                  p_00->pParse->iFixedOp = uVar12 - 1;
                  uVar14 = 0;
                  do {
                    uVar12 = *(uint *)((long)p_01 + uVar14 * 4);
                    uVar1 = p_00->nOp;
                    if (uVar12 < uVar1) {
                      p_00->aOp[uVar12].p2 = uVar1;
                    }
                    p_00->pParse->iFixedOp = uVar1 - 1;
                    sqlite3VdbeAddOp3(p_00,0x2f,p1,(int)uVar14,p1_00 + (int)uVar14);
                    uVar14 = uVar14 + 1;
                  } while (uVar11 != uVar14);
                  pPVar2 = p_00->pParse;
                  if (((int)p2_00 < 0) && (piVar3 = pPVar2->aLabel, piVar3 != (int *)0x0)) {
                    piVar3[~p2_00] = p_00->nOp;
                  }
                  pPVar2->iFixedOp = p_00->nOp + -1;
                  sqlite3DbFree(db,p_01);
                }
                if (p_01 == (void *)0x0) goto LAB_0017076a;
              }
              sqlite3VdbeAddOp3(p_00,1,1,iVar6,p2_01);
              sqlite3VdbeChangeP4(p_00,-1,(char *)&statPushFuncdef,-5);
              if (p_00->aOp != (Op *)0x0) {
                p_00->aOp[(long)p_00->nOp + -1].p5 = '\x02';
              }
              sqlite3VdbeAddOp3(p_00,9,p1,iVar7,0);
              sqlite3VdbeAddOp3(p_00,1,0,iVar6,p3);
              sqlite3VdbeChangeP4(p_00,-1,(char *)&statGetFuncdef,-5);
              if (p_00->aOp != (Op *)0x0) {
                p_00->aOp[(long)p_00->nOp + -1].p5 = '\x01';
              }
              iVar7 = sqlite3VdbeAddOp3(p_00,0x31,p2_02,3,p2_01);
              sqlite3VdbeChangeP4(p_00,iVar7,"BBB",0);
              sqlite3VdbeAddOp3(p_00,0x4a,iStatCur,iMem,0);
              sqlite3VdbeAddOp3(p_00,0x4b,iStatCur,p2_01,iMem);
              pOVar4 = p_00->aOp;
              if (pOVar4 != (Op *)0x0) {
                pOVar4[(long)p_00->nOp + -1].p5 = '\b';
              }
              uVar12 = p_00->nOp;
              if (uVar8 < uVar12) {
                pOVar4[uVar8].p2 = uVar12;
              }
              p_00->pParse->iFixedOp = uVar12 - 1;
            }
LAB_0017076a:
            pIdx = pIdx->pNext;
          } while (pIdx != (Index *)0x0);
        }
        if ((pOnlyIdx == (Index *)0x0) && (bVar5)) {
          sqlite3VdbeAddOp3(p_00,0x32,iTab,p3,0);
          uVar12 = sqlite3VdbeAddOp3(p_00,0x2e,p3,0,0);
          sqlite3VdbeAddOp3(p_00,0x1c,0,iMem + 5,0);
          iVar6 = sqlite3VdbeAddOp3(p_00,0x31,p2_02,3,p2_01);
          sqlite3VdbeChangeP4(p_00,iVar6,"BBB",0);
          sqlite3VdbeAddOp3(p_00,0x4a,iStatCur,iMem,0);
          sqlite3VdbeAddOp3(p_00,0x4b,iStatCur,p2_01,iMem);
          pOVar4 = p_00->aOp;
          if (pOVar4 != (Op *)0x0) {
            pOVar4[(long)p_00->nOp + -1].p5 = '\b';
          }
          uVar8 = p_00->nOp;
          if (uVar12 < uVar8) {
            pOVar4[uVar12].p2 = uVar8;
          }
          p_00->pParse->iFixedOp = uVar8 - 1;
        }
      }
    }
  }
  return;
}

Assistant:

static void analyzeOneTable(
  Parse *pParse,   /* Parser context */
  Table *pTab,     /* Table whose indices are to be analyzed */
  Index *pOnlyIdx, /* If not NULL, only analyze this one index */
  int iStatCur,    /* Index of VdbeCursor that writes the sqlite_stat1 table */
  int iMem,        /* Available memory locations begin here */
  int iTab         /* Next available cursor */
){
  sqlite3 *db = pParse->db;    /* Database handle */
  Index *pIdx;                 /* An index to being analyzed */
  int iIdxCur;                 /* Cursor open on index being analyzed */
  int iTabCur;                 /* Table cursor */
  Vdbe *v;                     /* The virtual machine being built up */
  int i;                       /* Loop counter */
  int jZeroRows = -1;          /* Jump from here if number of rows is zero */
  int iDb;                     /* Index of database containing pTab */
  u8 needTableCnt = 1;         /* True to count the table */
  int regNewRowid = iMem++;    /* Rowid for the inserted record */
  int regStat4 = iMem++;       /* Register to hold Stat4Accum object */
  int regChng = iMem++;        /* Index of changed index field */
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  int regRowid = iMem++;       /* Rowid argument passed to stat_push() */
#endif
  int regTemp = iMem++;        /* Temporary use register */
  int regTabname = iMem++;     /* Register containing table name */
  int regIdxname = iMem++;     /* Register containing index name */
  int regStat1 = iMem++;       /* Value for the stat column of sqlite_stat1 */
  int regPrev = iMem;          /* MUST BE LAST (see below) */

  pParse->nMem = MAX(pParse->nMem, iMem);
  v = sqlite3GetVdbe(pParse);
  if( v==0 || NEVER(pTab==0) ){
    return;
  }
  if( pTab->tnum==0 ){
    /* Do not gather statistics on views or virtual tables */
    return;
  }
  if( sqlite3_strnicmp(pTab->zName, "sqlite_", 7)==0 ){
    /* Do not gather statistics on system tables */
    return;
  }
  assert( sqlite3BtreeHoldsAllMutexes(db) );
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb>=0 );
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
#ifndef SQLITE_OMIT_AUTHORIZATION
  if( sqlite3AuthCheck(pParse, SQLITE_ANALYZE, pTab->zName, 0,
      db->aDb[iDb].zName ) ){
    return;
  }
#endif

  /* Establish a read-lock on the table at the shared-cache level. 
  ** Open a read-only cursor on the table. Also allocate a cursor number
  ** to use for scanning indexes (iIdxCur). No index cursor is opened at
  ** this time though.  */
  sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);
  iTabCur = iTab++;
  iIdxCur = iTab++;
  pParse->nTab = MAX(pParse->nTab, iTab);
  sqlite3OpenTable(pParse, iTabCur, iDb, pTab, OP_OpenRead);
  sqlite3VdbeAddOp4(v, OP_String8, 0, regTabname, 0, pTab->zName, 0);

  for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    int nCol;                     /* Number of columns in pIdx. "N" */
    int addrRewind;               /* Address of "OP_Rewind iIdxCur" */
    int addrNextRow;              /* Address of "next_row:" */
    const char *zIdxName;         /* Name of the index */
    int nColTest;                 /* Number of columns to test for changes */

    if( pOnlyIdx && pOnlyIdx!=pIdx ) continue;
    if( pIdx->pPartIdxWhere==0 ) needTableCnt = 0;
    if( !HasRowid(pTab) && IsPrimaryKeyIndex(pIdx) ){
      nCol = pIdx->nKeyCol;
      zIdxName = pTab->zName;
      nColTest = nCol - 1;
    }else{
      nCol = pIdx->nColumn;
      zIdxName = pIdx->zName;
      nColTest = pIdx->uniqNotNull ? pIdx->nKeyCol-1 : nCol-1;
    }

    /* Populate the register containing the index name. */
    sqlite3VdbeAddOp4(v, OP_String8, 0, regIdxname, 0, zIdxName, 0);
    VdbeComment((v, "Analysis for %s.%s", pTab->zName, zIdxName));

    /*
    ** Pseudo-code for loop that calls stat_push():
    **
    **   Rewind csr
    **   if eof(csr) goto end_of_scan;
    **   regChng = 0
    **   goto chng_addr_0;
    **
    **  next_row:
    **   regChng = 0
    **   if( idx(0) != regPrev(0) ) goto chng_addr_0
    **   regChng = 1
    **   if( idx(1) != regPrev(1) ) goto chng_addr_1
    **   ...
    **   regChng = N
    **   goto chng_addr_N
    **
    **  chng_addr_0:
    **   regPrev(0) = idx(0)
    **  chng_addr_1:
    **   regPrev(1) = idx(1)
    **  ...
    **
    **  endDistinctTest:
    **   regRowid = idx(rowid)
    **   stat_push(P, regChng, regRowid)
    **   Next csr
    **   if !eof(csr) goto next_row;
    **
    **  end_of_scan:
    */

    /* Make sure there are enough memory cells allocated to accommodate 
    ** the regPrev array and a trailing rowid (the rowid slot is required
    ** when building a record to insert into the sample column of 
    ** the sqlite_stat4 table.  */
    pParse->nMem = MAX(pParse->nMem, regPrev+nColTest);

    /* Open a read-only cursor on the index being analyzed. */
    assert( iDb==sqlite3SchemaToIndex(db, pIdx->pSchema) );
    sqlite3VdbeAddOp3(v, OP_OpenRead, iIdxCur, pIdx->tnum, iDb);
    sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
    VdbeComment((v, "%s", pIdx->zName));

    /* Invoke the stat_init() function. The arguments are:
    ** 
    **    (1) the number of columns in the index including the rowid
    **        (or for a WITHOUT ROWID table, the number of PK columns),
    **    (2) the number of columns in the key without the rowid/pk
    **    (3) the number of rows in the index,
    **
    **
    ** The third argument is only used for STAT3 and STAT4
    */
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    sqlite3VdbeAddOp2(v, OP_Count, iIdxCur, regStat4+3);
#endif
    sqlite3VdbeAddOp2(v, OP_Integer, nCol, regStat4+1);
    sqlite3VdbeAddOp2(v, OP_Integer, pIdx->nKeyCol, regStat4+2);
    sqlite3VdbeAddOp3(v, OP_Function, 0, regStat4+1, regStat4);
    sqlite3VdbeChangeP4(v, -1, (char*)&statInitFuncdef, P4_FUNCDEF);
    sqlite3VdbeChangeP5(v, 2+IsStat34);

    /* Implementation of the following:
    **
    **   Rewind csr
    **   if eof(csr) goto end_of_scan;
    **   regChng = 0
    **   goto next_push_0;
    **
    */
    addrRewind = sqlite3VdbeAddOp1(v, OP_Rewind, iIdxCur);
    VdbeCoverage(v);
    sqlite3VdbeAddOp2(v, OP_Integer, 0, regChng);
    addrNextRow = sqlite3VdbeCurrentAddr(v);

    if( nColTest>0 ){
      int endDistinctTest = sqlite3VdbeMakeLabel(v);
      int *aGotoChng;               /* Array of jump instruction addresses */
      aGotoChng = sqlite3DbMallocRaw(db, sizeof(int)*nColTest);
      if( aGotoChng==0 ) continue;

      /*
      **  next_row:
      **   regChng = 0
      **   if( idx(0) != regPrev(0) ) goto chng_addr_0
      **   regChng = 1
      **   if( idx(1) != regPrev(1) ) goto chng_addr_1
      **   ...
      **   regChng = N
      **   goto endDistinctTest
      */
      sqlite3VdbeAddOp0(v, OP_Goto);
      addrNextRow = sqlite3VdbeCurrentAddr(v);
      if( nColTest==1 && pIdx->nKeyCol==1 && IsUniqueIndex(pIdx) ){
        /* For a single-column UNIQUE index, once we have found a non-NULL
        ** row, we know that all the rest will be distinct, so skip 
        ** subsequent distinctness tests. */
        sqlite3VdbeAddOp2(v, OP_NotNull, regPrev, endDistinctTest);
        VdbeCoverage(v);
      }
      for(i=0; i<nColTest; i++){
        char *pColl = (char*)sqlite3LocateCollSeq(pParse, pIdx->azColl[i]);
        sqlite3VdbeAddOp2(v, OP_Integer, i, regChng);
        sqlite3VdbeAddOp3(v, OP_Column, iIdxCur, i, regTemp);
        aGotoChng[i] = 
        sqlite3VdbeAddOp4(v, OP_Ne, regTemp, 0, regPrev+i, pColl, P4_COLLSEQ);
        sqlite3VdbeChangeP5(v, SQLITE_NULLEQ);
        VdbeCoverage(v);
      }
      sqlite3VdbeAddOp2(v, OP_Integer, nColTest, regChng);
      sqlite3VdbeAddOp2(v, OP_Goto, 0, endDistinctTest);
  
  
      /*
      **  chng_addr_0:
      **   regPrev(0) = idx(0)
      **  chng_addr_1:
      **   regPrev(1) = idx(1)
      **  ...
      */
      sqlite3VdbeJumpHere(v, addrNextRow-1);
      for(i=0; i<nColTest; i++){
        sqlite3VdbeJumpHere(v, aGotoChng[i]);
        sqlite3VdbeAddOp3(v, OP_Column, iIdxCur, i, regPrev+i);
      }
      sqlite3VdbeResolveLabel(v, endDistinctTest);
      sqlite3DbFree(db, aGotoChng);
    }
  
    /*
    **  chng_addr_N:
    **   regRowid = idx(rowid)            // STAT34 only
    **   stat_push(P, regChng, regRowid)  // 3rd parameter STAT34 only
    **   Next csr
    **   if !eof(csr) goto next_row;
    */
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    assert( regRowid==(regStat4+2) );
    if( HasRowid(pTab) ){
      sqlite3VdbeAddOp2(v, OP_IdxRowid, iIdxCur, regRowid);
    }else{
      Index *pPk = sqlite3PrimaryKeyIndex(pIdx->pTable);
      int j, k, regKey;
      regKey = sqlite3GetTempRange(pParse, pPk->nKeyCol);
      for(j=0; j<pPk->nKeyCol; j++){
        k = sqlite3ColumnOfIndex(pIdx, pPk->aiColumn[j]);
        sqlite3VdbeAddOp3(v, OP_Column, iIdxCur, k, regKey+j);
        VdbeComment((v, "%s", pTab->aCol[pPk->aiColumn[j]].zName));
      }
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regKey, pPk->nKeyCol, regRowid);
      sqlite3ReleaseTempRange(pParse, regKey, pPk->nKeyCol);
    }
#endif
    assert( regChng==(regStat4+1) );
    sqlite3VdbeAddOp3(v, OP_Function, 1, regStat4, regTemp);
    sqlite3VdbeChangeP4(v, -1, (char*)&statPushFuncdef, P4_FUNCDEF);
    sqlite3VdbeChangeP5(v, 2+IsStat34);
    sqlite3VdbeAddOp2(v, OP_Next, iIdxCur, addrNextRow); VdbeCoverage(v);

    /* Add the entry to the stat1 table. */
    callStatGet(v, regStat4, STAT_GET_STAT1, regStat1);
    assert( "BBB"[0]==SQLITE_AFF_TEXT );
    sqlite3VdbeAddOp4(v, OP_MakeRecord, regTabname, 3, regTemp, "BBB", 0);
    sqlite3VdbeAddOp2(v, OP_NewRowid, iStatCur, regNewRowid);
    sqlite3VdbeAddOp3(v, OP_Insert, iStatCur, regTemp, regNewRowid);
    sqlite3VdbeChangeP5(v, OPFLAG_APPEND);

    /* Add the entries to the stat3 or stat4 table. */
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    {
      int regEq = regStat1;
      int regLt = regStat1+1;
      int regDLt = regStat1+2;
      int regSample = regStat1+3;
      int regCol = regStat1+4;
      int regSampleRowid = regCol + nCol;
      int addrNext;
      int addrIsNull;
      u8 seekOp = HasRowid(pTab) ? OP_NotExists : OP_NotFound;

      pParse->nMem = MAX(pParse->nMem, regCol+nCol);

      addrNext = sqlite3VdbeCurrentAddr(v);
      callStatGet(v, regStat4, STAT_GET_ROWID, regSampleRowid);
      addrIsNull = sqlite3VdbeAddOp1(v, OP_IsNull, regSampleRowid);
      VdbeCoverage(v);
      callStatGet(v, regStat4, STAT_GET_NEQ, regEq);
      callStatGet(v, regStat4, STAT_GET_NLT, regLt);
      callStatGet(v, regStat4, STAT_GET_NDLT, regDLt);
      sqlite3VdbeAddOp4Int(v, seekOp, iTabCur, addrNext, regSampleRowid, 0);
      /* We know that the regSampleRowid row exists because it was read by
      ** the previous loop.  Thus the not-found jump of seekOp will never
      ** be taken */
      VdbeCoverageNeverTaken(v);
#ifdef SQLITE_ENABLE_STAT3
      sqlite3ExprCodeGetColumnOfTable(v, pTab, iTabCur, 
                                      pIdx->aiColumn[0], regSample);
#else
      for(i=0; i<nCol; i++){
        i16 iCol = pIdx->aiColumn[i];
        sqlite3ExprCodeGetColumnOfTable(v, pTab, iTabCur, iCol, regCol+i);
      }
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regCol, nCol, regSample);
#endif
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regTabname, 6, regTemp);
      sqlite3VdbeAddOp2(v, OP_NewRowid, iStatCur+1, regNewRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, iStatCur+1, regTemp, regNewRowid);
      sqlite3VdbeAddOp2(v, OP_Goto, 1, addrNext); /* P1==1 for end-of-loop */
      sqlite3VdbeJumpHere(v, addrIsNull);
    }
#endif /* SQLITE_ENABLE_STAT3_OR_STAT4 */

    /* End of analysis */
    sqlite3VdbeJumpHere(v, addrRewind);
  }


  /* Create a single sqlite_stat1 entry containing NULL as the index
  ** name and the row count as the content.
  */
  if( pOnlyIdx==0 && needTableCnt ){
    VdbeComment((v, "%s", pTab->zName));
    sqlite3VdbeAddOp2(v, OP_Count, iTabCur, regStat1);
    jZeroRows = sqlite3VdbeAddOp1(v, OP_IfNot, regStat1); VdbeCoverage(v);
    sqlite3VdbeAddOp2(v, OP_Null, 0, regIdxname);
    assert( "BBB"[0]==SQLITE_AFF_TEXT );
    sqlite3VdbeAddOp4(v, OP_MakeRecord, regTabname, 3, regTemp, "BBB", 0);
    sqlite3VdbeAddOp2(v, OP_NewRowid, iStatCur, regNewRowid);
    sqlite3VdbeAddOp3(v, OP_Insert, iStatCur, regTemp, regNewRowid);
    sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
    sqlite3VdbeJumpHere(v, jZeroRows);
  }
}